

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CallGraph.h
# Opt level: O1

void __thiscall
dg::llvmdg::LazyLLVMCallGraph::processBBlock
          (LazyLLVMCallGraph *this,Function *parent,BasicBlock *B,
          SetQueue<dg::ADT::QueueFIFO<const_llvm::Function_*>_> *queue)

{
  LLVMPointerAnalysis *pLVar1;
  bool bVar2;
  int iVar3;
  undefined8 uVar4;
  undefined4 extraout_var;
  CallCompatibility policy;
  BasicBlock *pBVar5;
  LLVMPointsToSetImpl *pLVar6;
  BasicBlock *pBVar7;
  BasicBlock *pBVar8;
  BasicBlock *CI;
  const_iterator __begin4;
  LLVMPointsToSet pts;
  Function *F;
  const_iterator __end4;
  const_iterator local_78;
  LazyLLVMCallGraph *local_70;
  LLVMPointsToSetImpl *local_68;
  GenericCallGraph<const_llvm::Function_*> *local_60;
  BasicBlock *local_58;
  SetQueue<dg::ADT::QueueFIFO<const_llvm::Function_*>_> *local_50;
  Function *local_48;
  const_iterator local_40;
  Function *local_38;
  
  pBVar7 = *(BasicBlock **)(B + 0x30);
  pBVar5 = B + 0x28;
  if (pBVar7 != pBVar5) {
    local_70 = this;
    local_60 = &this->_cg;
    local_58 = pBVar5;
    local_50 = queue;
    local_38 = parent;
    do {
      pBVar8 = pBVar7 + -0x18;
      if (pBVar7 == (BasicBlock *)0x0) {
        pBVar8 = (BasicBlock *)0x0;
      }
      CI = pBVar8;
      if (pBVar8[0x10] != (BasicBlock)0x53) {
        CI = (BasicBlock *)(CallInst *)0x0;
      }
      if (pBVar8[0x10] == (BasicBlock)0x53 && pBVar7 != (BasicBlock *)0x0) {
        pLVar1 = local_70->_pta;
        uVar4 = llvm::Value::stripPointerCasts();
        (*pLVar1->_vptr_LLVMPointerAnalysis[1])(&local_68,pLVar1,uVar4);
        pLVar6 = local_68;
        if ((local_68 != (LLVMPointsToSetImpl *)0x0) &&
           (iVar3 = (*local_68->_vptr_LLVMPointsToSetImpl[7])(local_68), (char)iVar3 != '\0')) {
          pLVar6 = (LLVMPointsToSetImpl *)0x0;
        }
        local_40.impl = (LLVMPointsToSetImpl *)0x0;
        local_78.impl = pLVar6;
        while (bVar2 = LLVMPointsToSet::const_iterator::operator==(&local_78,&local_40), !bVar2) {
          iVar3 = (*(local_78.impl)->_vptr_LLVMPointsToSetImpl[9])();
          local_48 = (Function *)CONCAT44(extraout_var,iVar3);
          if (local_48[0x10] != (Function)0x0) {
            local_48 = (Function *)0x0;
          }
          if ((local_48 != (Function *)0x0) &&
             (bVar2 = anon_unknown_2::callIsCompatible(local_48,(CallInst *)CI,policy), bVar2)) {
            GenericCallGraph<const_llvm::Function_*>::addCall(&this->_cg,&local_38,&local_48);
            ADT::SetQueue<dg::ADT::QueueFIFO<const_llvm::Function_*>_>::push(local_50,&local_48);
          }
          (*(local_78.impl)->_vptr_LLVMPointsToSetImpl[8])();
          iVar3 = (*(local_78.impl)->_vptr_LLVMPointsToSetImpl[7])();
          if ((char)iVar3 != '\0') {
            local_78.impl = (LLVMPointsToSetImpl *)0x0;
          }
        }
        pBVar5 = local_58;
        if (local_68 != (LLVMPointsToSetImpl *)0x0) {
          (*local_68->_vptr_LLVMPointsToSetImpl[0xb])();
          pBVar5 = local_58;
        }
      }
      pBVar7 = *(BasicBlock **)(pBVar7 + 8);
    } while (pBVar7 != pBVar5);
  }
  return;
}

Assistant:

void
    processBBlock(const llvm::Function *parent, const llvm::BasicBlock &B,
                  ADT::SetQueue<QueueFIFO<const llvm::Function *>> &queue) {
        assert(_pta && "This method can be used only with PTA");
        for (auto &I : B) {
            if (auto *C = llvm::dyn_cast<llvm::CallInst>(&I)) {
                auto pts = _pta->getLLVMPointsTo(_getCalledValue(C));
                for (const auto &ptr : pts) {
                    if (auto *F = llvm::dyn_cast<llvm::Function>(ptr.value)) {
                        if (callIsCompatible(F, C)) {
                            _cg.addCall(parent, F);
                            queue.push(F);
                        }
                    }
                }
            }
        }
    }